

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
Wasm::WasmBytecodeGenerator::EmitLoadConst
          (WasmBytecodeGenerator *this,EmitInfo dst,WasmConstLitNode cnst)

{
  WasmCompilationException *this_00;
  ulong uVar1;
  WasmBytecodeGenerator *this_local;
  WasmConstLitNode cnst_local;
  EmitInfo dst_local;
  
  uVar1 = cnst.field_0.i64;
  cnst_local.field_0.v128[3] = dst.type;
  switch(cnst_local.field_0.v128[3]) {
  case 1:
    (*this->m_writer->_vptr_IWasmByteCodeWriter[10])
              (this->m_writer,9,(ulong)dst & 0xffffffff,uVar1 & 0xffffffff);
    break;
  case 2:
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xb])
              (this->m_writer,0xb,(ulong)dst & 0xffffffff,uVar1);
    break;
  case 3:
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xc])
              (uVar1 & 0xffffffff,this->m_writer,0xd,(ulong)dst & 0xffffffff);
    break;
  case 4:
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xd])
              (uVar1,this->m_writer,0xf,(ulong)dst & 0xffffffff);
    break;
  case 5:
    Simd::EnsureSimdIsEnabled();
    cnst_local.field_0.v128[1] = cnst.field_0._12_4_;
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0x17])
              (this->m_writer,0x18b,(ulong)dst & 0xffffffff,uVar1 & 0xffffffff,uVar1 >> 0x20,
               cnst.field_0._8_8_ & 0xffffffff,cnst_local.field_0.v128[1]);
    break;
  default:
    WasmTypes::
    CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_00,L"Unknown type %u",(ulong)cnst_local.field_0.v128[3]);
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  return;
}

Assistant:

void WasmBytecodeGenerator::EmitLoadConst(EmitInfo dst, WasmConstLitNode cnst)
{
    switch (dst.type)
    {
    case WasmTypes::F32:
        m_writer->AsmFloat1Const1(Js::OpCodeAsmJs::Ld_FltConst, dst.location, cnst.f32);
        break;
    case WasmTypes::F64:
        m_writer->AsmDouble1Const1(Js::OpCodeAsmJs::Ld_DbConst, dst.location, cnst.f64);
        break;
    case WasmTypes::I32:
        m_writer->AsmInt1Const1(Js::OpCodeAsmJs::Ld_IntConst, dst.location, cnst.i32);
        break;
    case WasmTypes::I64:
        m_writer->AsmLong1Const1(Js::OpCodeAsmJs::Ld_LongConst, dst.location, cnst.i64);
        break;
#ifdef ENABLE_WASM_SIMD
    case WasmTypes::V128:
    {
        Simd::EnsureSimdIsEnabled();
        m_writer->WasmSimdConst(Js::OpCodeAsmJs::Simd128_LdC, dst.location, cnst.v128[0], cnst.v128[1], cnst.v128[2], cnst.v128[3]);
        break;
    }
#endif
    default:
        WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
        throw WasmCompilationException(_u("Unknown type %u"), dst.type);
    }
}